

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<long_long,_std::allocator<long_long>_> *lhs,
          vector<long_long,_std::allocator<long_long>_> *rhs)

{
  vector<long_long,_std::allocator<long_long>_> *value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_68;
  string local_48;
  
  PrintToString<std::vector<long_long,std::allocator<long_long>>>
            (&local_68,(testing *)lhs,
             (vector<long_long,_std::allocator<long_long>_> *)rhs_expression);
  PrintToString<std::vector<long_long,std::allocator<long_long>>>(&local_48,(testing *)rhs,value);
  EqFailure(this,lhs_expression,rhs_expression,&local_68,&local_48,false);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}